

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O1

TPZAutoPointer<TPZRefPattern> __thiscall
TPZIdentifyRefPattern::GetRefPattern
          (TPZIdentifyRefPattern *this,TPZGeoEl *father,TPZVec<TPZGeoEl_*> *subelem)

{
  int iVar1;
  size_type sVar2;
  int iVar3;
  pointer pcVar4;
  TPZRefPattern *this_00;
  size_type *psVar5;
  TPZVec<TPZGeoEl_*> *in_RCX;
  TPZIdentifyRefPattern *this_01;
  TPZVec<TPZGeoEl_*> *this_02;
  TPZAutoPointer<TPZRefPattern> rp;
  TPZAutoPointer<TPZRefPattern> mesh_rp;
  undefined1 local_80 [8];
  string local_78;
  TPZGeoEl *local_58;
  TPZVec<TPZGeoEl_*> local_50;
  
  local_58 = father;
  iVar3 = (*subelem->_vptr_TPZVec[0x17])(subelem);
  iVar1 = (int)in_RCX->fNElements;
  this_01 = (TPZIdentifyRefPattern *)0x10;
  local_80 = (undefined1  [8])operator_new(0x10);
  *(char *)((long)local_80 + 0) = '\0';
  *(char *)((long)local_80 + 1) = '\0';
  *(char *)((long)local_80 + 2) = '\0';
  *(char *)((long)local_80 + 3) = '\0';
  *(char *)((long)local_80 + 4) = '\0';
  *(char *)((long)local_80 + 5) = '\0';
  *(char *)((long)local_80 + 6) = '\0';
  *(char *)((long)local_80 + 7) = '\0';
  *(char *)((long)local_80 + 8) = '\0';
  *(char *)((long)local_80 + 9) = '\0';
  *(char *)((long)local_80 + 10) = '\0';
  *(char *)((long)local_80 + 0xb) = '\0';
  LOCK();
  *(char *)((long)local_80 + 8) = '\x01';
  *(char *)((long)local_80 + 9) = '\0';
  *(char *)((long)local_80 + 10) = '\0';
  *(char *)((long)local_80 + 0xb) = '\0';
  UNLOCK();
  if (iVar3 == 1) {
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZIdentifyRefPattern::GetRefPattern ERROR : wrong linear partition detected!",
                 0x4d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzidentifyrefpattern.cpp"
                 ,0x2e);
    }
    this_00 = (TPZRefPattern *)operator_new(0x360);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"/home/pos/cesar/RefPattern/Unif_Linear.rpt","");
    TPZRefPattern::TPZRefPattern(this_00,(string *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    this_01 = (TPZIdentifyRefPattern *)local_80;
    TPZAutoPointer<TPZRefPattern>::operator=((TPZAutoPointer<TPZRefPattern> *)this_01,this_00);
  }
  else if (iVar3 == 0) {
    if (iVar1 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZIdentifyRefPattern::GetRefPattern ERROR : point partition detected!",0x46);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzidentifyrefpattern.cpp"
                 ,0x27);
    }
    pcVar4 = (pointer)operator_new(0x10);
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\0';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    LOCK();
    pcVar4[8] = '\x01';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    UNLOCK();
    (this->fPath)._M_dataplus._M_p = pcVar4;
    goto LAB_014683fe;
  }
  iVar3 = UniformSubElem(this_01,iVar3);
  if (iVar3 == iVar1) {
    GetUniform((TPZIdentifyRefPattern *)(local_80 + 8),local_58);
    TPZAutoPointer<TPZRefPattern>::operator=
              ((TPZAutoPointer<TPZRefPattern> *)local_80,
               (TPZAutoPointer<TPZRefPattern> *)(local_80 + 8));
  }
  else {
    this_02 = &local_50;
    TPZVec<TPZGeoEl_*>::TPZVec(this_02,in_RCX);
    IdentifySide((TPZIdentifyRefPattern *)this_02,(TPZGeoEl *)subelem,&local_50);
    local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b770;
    if (local_50.fStore != (TPZGeoEl **)0x0) {
      operator_delete__(local_50.fStore);
    }
    GetSideRefPattern((TPZIdentifyRefPattern *)(local_80 + 8),local_58,(int)subelem);
    TPZAutoPointer<TPZRefPattern>::operator=
              ((TPZAutoPointer<TPZRefPattern> *)local_80,
               (TPZAutoPointer<TPZRefPattern> *)(local_80 + 8));
  }
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)(local_80 + 8));
  TPZRefPatternDataBase::FindRefPattern
            ((TPZRefPatternDataBase *)(local_80 + 8),(TPZAutoPointer<TPZRefPattern> *)&gRefDBase);
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_78._M_dataplus._M_p ==
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0) || (*(size_type *)local_78._M_dataplus._M_p == 0)) {
    TPZRefPatternDataBase::InsertRefPattern(&gRefDBase,(TPZAutoPointer<TPZRefPattern> *)local_80);
    (this->fPath)._M_dataplus._M_p = (pointer)local_80;
    local_80 = (undefined1  [8])0x0;
  }
  else {
    sVar2 = *(size_type *)local_78._M_dataplus._M_p;
    psVar5 = (size_type *)operator_new(0x10);
    *(undefined4 *)(psVar5 + 1) = 0;
    *psVar5 = sVar2;
    LOCK();
    *(undefined4 *)(psVar5 + 1) = 1;
    UNLOCK();
    (this->fPath)._M_dataplus._M_p = (pointer)psVar5;
  }
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)(local_80 + 8));
LAB_014683fe:
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_80);
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZIdentifyRefPattern::GetRefPattern (TPZGeoEl *father, TPZVec<TPZGeoEl *> subelem){
	MElementType eltype =  father->Type();
	int nelem = subelem.NElements();
	TPZAutoPointer<TPZRefPattern> rp;
	switch (eltype) {
		case (EPoint) : {
			if (nelem != 1){
				PZError << "TPZIdentifyRefPattern::GetRefPattern ERROR : point partition detected!" << endl;
				DebugStop();
			}
			return 0;// return refpattern for point!!
		}
		case (EOned) :{
			if (nelem != 2){
				PZError << "TPZIdentifyRefPattern::GetRefPattern ERROR : wrong linear partition detected!" << endl;
				DebugStop();
			}
			TPZRefPattern * newRef = new TPZRefPattern ("/home/pos/cesar/RefPattern/Unif_Linear.rpt");
			rp = newRef;
		}
		default : {
			//return a uniform refinement pattern
			if (nelem == UniformSubElem(eltype)) {
				rp = GetUniform(father);
			} else {
				//identify the side refinement pattern
				int side = IdentifySide(father,subelem);
				rp = GetSideRefPattern(father,side);
			}
		}
	}
	TPZAutoPointer<TPZRefPattern> mesh_rp = gRefDBase.FindRefPattern(rp);
	//If the refinement pattern is already defined delete the created refinement pattern
	if (mesh_rp) {
		return mesh_rp.operator->();
	}
	//Insert a new refinement pattern into mesh
	gRefDBase.InsertRefPattern(rp);
	return rp;
}